

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O3

int __thiscall
BlockDevice::ScsiCmd
          (BlockDevice *this,int fd,uint8_t *cmd,int cmd_len,void *data,int data_len,bool read)

{
  int iVar1;
  undefined1 auStack_88 [40];
  undefined4 local_60;
  int local_5c;
  undefined8 local_58;
  void *pvStack_50;
  uint8_t *local_48;
  undefined1 *puStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  ulong uStack_10;
  
  puStack_40 = auStack_88;
  uStack_30 = 0;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_60 = 0x53;
  local_5c = -2 - (uint)read;
  local_58._0_2_ = CONCAT11(0x20,(char)cmd_len);
  local_58 = CONCAT62((int6)(CONCAT44(data_len,cmd_len) >> 0x10),(undefined2)local_58) &
             0xffffffff0000ffff;
  local_38 = 5000;
  pvStack_50 = data;
  local_48 = cmd;
  iVar1 = ioctl(fd,0x2285,&local_60);
  if ((-1 < iVar1) && ((!read || (iVar1 = -0x26, (uStack_10 & 1) == 0)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int BlockDevice::ScsiCmd(int fd, const uint8_t* cmd, int cmd_len, void* data, int data_len, bool read)
{
#if defined(HAVE_SCSI_SCSI_H) && defined(HAVE_SCSI_SG_H)
    uint8_t sense[32];

    struct sg_io_hdr io_hdr = {};
    io_hdr.interface_id = 'S';
    io_hdr.cmdp = const_cast<uint8_t*>(cmd);
    io_hdr.cmd_len = cmd_len;
    io_hdr.dxferp = data;
    io_hdr.dxfer_len = data_len;
    io_hdr.dxfer_direction = read ? SG_DXFER_FROM_DEV : SG_DXFER_TO_DEV;
    io_hdr.sbp = sense;
    io_hdr.mx_sb_len = sizeof(sense);
    io_hdr.timeout = 5000;

    auto ret = ioctl(fd, SG_IO, &io_hdr);
    if (ret < 0)
        return ret;

    if (read && (io_hdr.info & SG_INFO_OK_MASK) != SG_INFO_OK)
        return -ENOSYS;

    return 0;
#else
    (void)fd; (void)cmd; (void)cmd_len; (void)data; (void)data_len; (void)read;
    return -ENOTSUP;
#endif // HAVE_SCSI_SCSI_H && HAVE_SCSI_SG_H
}